

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O0

void __thiscall r_code::LObject::set_reference(LObject *this,uint16_t i,Code *object)

{
  P<r_code::Code> *this_00;
  Code *object_local;
  uint16_t i_local;
  LObject *this_local;
  
  this_00 = vector<core::P<r_code::Code>_>::operator[](&this->_references,(ulong)i);
  core::P<r_code::Code>::operator=(this_00,object);
  return;
}

Assistant:

void set_reference(uint16_t i, Code *object)
    {
        _references[i] = object;
    }